

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

bitboards * FENboardToBitboards(bitboards *__return_storage_ptr__,char *board,int length)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  char array [64];
  char local_48 [64];
  
  uVar2 = 0;
  uVar4 = (ulong)(uint)length;
  if (length < 1) {
    uVar4 = uVar2;
  }
  iVar3 = 0;
  for (; uVar2 != uVar4; uVar2 = uVar2 + 1) {
    cVar1 = board[uVar2];
    if (cVar1 != '/') {
      lVar5 = (long)iVar3;
      if ((byte)(cVar1 - 0x31U) < 8) {
        iVar3 = iVar3 + (uint)(byte)(cVar1 - 0x30);
        for (; lVar5 < iVar3; lVar5 = lVar5 + 1) {
          local_48[lVar5] = ' ';
        }
      }
      else {
        local_48[lVar5] = cVar1;
        iVar3 = iVar3 + 1;
      }
    }
  }
  __return_storage_ptr__->BQ = 0;
  __return_storage_ptr__->BK = 0;
  __return_storage_ptr__->BB = 0;
  __return_storage_ptr__->BR = 0;
  __return_storage_ptr__->BP = 0;
  __return_storage_ptr__->BN = 0;
  __return_storage_ptr__->WQ = 0;
  __return_storage_ptr__->WK = 0;
  __return_storage_ptr__->WB = 0;
  __return_storage_ptr__->WR = 0;
  __return_storage_ptr__->WP = 0;
  __return_storage_ptr__->WN = 0;
  (__return_storage_ptr__->castleInfo).whiteACan = true;
  (__return_storage_ptr__->castleInfo).whiteHCan = true;
  (__return_storage_ptr__->castleInfo).blackACan = true;
  (__return_storage_ptr__->castleInfo).blackHCan = true;
  bitboards::standardArrayToBitboards(__return_storage_ptr__,local_48);
  return __return_storage_ptr__;
}

Assistant:

bitboards FENboardToBitboards(const char* board, const int length) {
  char array[64];
  int j = 0;
  for(int i = 0; i < length; i++) {
    if(board[i] == '/')
      continue;
    if(board[i] - '1' >= 0 && board[i] - '8' <= 0) {
      int blanks = board[i] - '0';
      for(int k = j; k < j + blanks; k++)
      {
        array[k] = ' ';
      }
      j += blanks;
    }
    else {
      array[j] = board[i];
      j++;
    }
  }

  bitboards returnBoards;
  returnBoards.standardArrayToBitboards(array);
  return returnBoards;
}